

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode h2_progress_egress(Curl_cfilter *cf,Curl_easy *data)

{
  bufq *q;
  byte *pbVar1;
  HTTP *pHVar2;
  undefined8 *puVar3;
  void *pvVar4;
  _Bool _Var5;
  uint lib_error_code;
  int iVar6;
  char *pcVar7;
  ssize_t sVar8;
  size_t sVar9;
  int iVar10;
  uint *puVar11;
  CURLcode CVar12;
  nghttp2_priority_spec pri_spec;
  nghttp2_priority_spec local_3c;
  
  if ((data == (Curl_easy *)0x0) || (pHVar2 = (data->req).p.http, pHVar2 == (HTTP *)0x0)) {
    puVar11 = (uint *)0x0;
  }
  else {
    puVar11 = (uint *)pHVar2->h2_ctx;
  }
  puVar3 = (undefined8 *)cf->ctx;
  if ((puVar11 != (uint *)0x0) && (0 < (int)*puVar11)) {
    iVar6 = (data->set).priority.weight;
    if (iVar6 == 0) {
      iVar6 = 0x10;
    }
    iVar10 = (data->state).priority.weight;
    if (iVar10 == 0) {
      iVar10 = 0x10;
    }
    if (((iVar6 != iVar10) ||
        ((((data->state).priority.field_0x14 ^ (data->set).priority.field_0x14) & 1) != 0)) ||
       ((data->set).priority.parent != (data->state).priority.parent)) {
      h2_pri_spec(data,&local_3c);
      if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
         (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"[%d] Queuing PRIORITY",(ulong)*puVar11);
      }
      lib_error_code = nghttp2_submit_priority((nghttp2_session *)*puVar3,'\0',*puVar11,&local_3c);
      if (lib_error_code != 0) goto LAB_005e8da5;
    }
  }
  *(byte *)(puVar3 + 0x19) = *(byte *)(puVar3 + 0x19) & 0xf7;
  do {
    lib_error_code = 0;
    if (((*(byte *)(puVar3 + 0x19) & 8) != 0) ||
       (iVar6 = nghttp2_session_want_write((nghttp2_session *)*puVar3), iVar6 == 0)) break;
    lib_error_code = nghttp2_session_send((nghttp2_session *)*puVar3);
  } while (lib_error_code == 0);
LAB_005e8da5:
  iVar6 = nghttp2_is_fatal(lib_error_code);
  if (iVar6 == 0) {
    pvVar4 = cf->ctx;
    q = (bufq *)((long)pvVar4 + 0x58);
    _Var5 = Curl_bufq_is_empty(q);
    CVar12 = CURLE_OK;
    if (!_Var5) {
      sVar8 = Curl_bufq_pass(q,nw_out_writer,cf,(CURLcode *)&local_3c);
      if (sVar8 < 0) {
        CVar12 = local_3c.stream_id;
        if (local_3c.stream_id == CURLE_AGAIN) {
          if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
              ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level))
          {
            sVar9 = Curl_bufq_len(q);
            Curl_trc_cf_infof(data,cf,"flush nw send buffer(%zu) -> EAGAIN",sVar9);
          }
          pbVar1 = (byte *)((long)pvVar4 + 200);
          *pbVar1 = *pbVar1 | 8;
          CVar12 = local_3c.stream_id;
        }
      }
      else {
        _Var5 = Curl_bufq_is_empty(q);
        CVar12 = CURLE_AGAIN;
        if (_Var5) {
          CVar12 = CURLE_OK;
        }
      }
    }
  }
  else {
    CVar12 = CURLE_SEND_ERROR;
    if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
       (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
      pcVar7 = nghttp2_strerror(lib_error_code);
      Curl_trc_cf_infof(data,cf,"nghttp2_session_send error (%s)%d",pcVar7,(ulong)lib_error_code);
    }
  }
  return CVar12;
}

Assistant:

static CURLcode h2_progress_egress(struct Curl_cfilter *cf,
                                  struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  int rv = 0;

  if(stream && stream->id > 0 &&
     ((sweight_wanted(data) != sweight_in_effect(data)) ||
      (data->set.priority.exclusive != data->state.priority.exclusive) ||
      (data->set.priority.parent != data->state.priority.parent)) ) {
    /* send new weight and/or dependency */
    nghttp2_priority_spec pri_spec;

    h2_pri_spec(data, &pri_spec);
    CURL_TRC_CF(data, cf, "[%d] Queuing PRIORITY", stream->id);
    DEBUGASSERT(stream->id != -1);
    rv = nghttp2_submit_priority(ctx->h2, NGHTTP2_FLAG_NONE,
                                 stream->id, &pri_spec);
    if(rv)
      goto out;
  }

  ctx->nw_out_blocked = 0;
  while(!rv && !ctx->nw_out_blocked && nghttp2_session_want_write(ctx->h2))
    rv = nghttp2_session_send(ctx->h2);

out:
  if(nghttp2_is_fatal(rv)) {
    CURL_TRC_CF(data, cf, "nghttp2_session_send error (%s)%d",
                nghttp2_strerror(rv), rv);
    return CURLE_SEND_ERROR;
  }
  return nw_out_flush(cf, data);
}